

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint local_68;
  undefined1 local_64 [4];
  uint i;
  easy_pollset ps;
  int this_max_fd;
  Curl_easy *data;
  int *max_fd_local;
  fd_set *exc_fd_set_local;
  fd_set *write_fd_set_local;
  fd_set *read_fd_set_local;
  Curl_multi *multi_local;
  
  ps.actions[0] = 0xff;
  ps.actions[1] = 0xff;
  ps.actions[2] = 0xff;
  ps.actions[3] = 0xff;
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if (((byte)multi->field_0x1b1 >> 2 & 1) == 0) {
    memset(local_64,0,0x20);
    for (unique0x00012000 = multi->easyp; stack0xffffffffffffffc0 != (Curl_easy *)0x0;
        unique0x00012000 = stack0xffffffffffffffc0->next) {
      multi_getsock(stack0xffffffffffffffc0,(easy_pollset *)local_64);
      for (local_68 = 0; local_68 < (uint)ps.sockets[3]; local_68 = local_68 + 1) {
        if (*(int *)(local_64 + (ulong)local_68 * 4) < 0x400) {
          if ((*(byte *)((long)ps.sockets + (ulong)local_68 + 0x10) & 1) != 0) {
            read_fd_set->fds_bits[*(int *)(local_64 + (ulong)local_68 * 4) / 0x40] =
                 1L << ((byte)((long)*(int *)(local_64 + (ulong)local_68 * 4) % 0x40) & 0x3f) |
                 read_fd_set->fds_bits[*(int *)(local_64 + (ulong)local_68 * 4) / 0x40];
          }
          if ((*(byte *)((long)ps.sockets + (ulong)local_68 + 0x10) & 2) != 0) {
            write_fd_set->fds_bits[*(int *)(local_64 + (ulong)local_68 * 4) / 0x40] =
                 1L << ((byte)((long)*(int *)(local_64 + (ulong)local_68 * 4) % 0x40) & 0x3f) |
                 write_fd_set->fds_bits[*(int *)(local_64 + (ulong)local_68 * 4) / 0x40];
          }
          if ((int)ps.actions._0_4_ < *(int *)(local_64 + (ulong)local_68 * 4)) {
            ps.actions._0_4_ = *(undefined4 *)(local_64 + (ulong)local_68 * 4);
          }
        }
      }
    }
    *max_fd = ps.actions._0_4_;
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_easy *data;
  int this_max_fd = -1;
  struct easy_pollset ps;
  unsigned int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  memset(&ps, 0, sizeof(ps));
  for(data = multi->easyp; data; data = data->next) {
    multi_getsock(data, &ps);

    for(i = 0; i < ps.num; i++) {
      if(!FDSET_SOCK(ps.sockets[i]))
        /* pretend it doesn't exist */
        continue;
      if(ps.actions[i] & CURL_POLL_IN)
        FD_SET(ps.sockets[i], read_fd_set);
      if(ps.actions[i] & CURL_POLL_OUT)
        FD_SET(ps.sockets[i], write_fd_set);
      if((int)ps.sockets[i] > this_max_fd)
        this_max_fd = (int)ps.sockets[i];
    }
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}